

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_compact.hpp
# Opt level: O2

void __thiscall Catch::CompactReporter::AssertionPrinter::printSourceInfo(AssertionPrinter *this)

{
  ostream *os;
  Colour colourGuard;
  SourceLineInfo local_38;
  
  colourGuard.m_moved = false;
  Colour::use(FileName);
  os = this->stream;
  SourceLineInfo::SourceLineInfo(&local_38,&(this->result->m_info).lineInfo);
  operator<<(os,&local_38);
  std::operator<<(os,":");
  std::__cxx11::string::~string((string *)&local_38);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void printSourceInfo() const {
                Colour colourGuard( Colour::FileName );
                stream << result.getSourceInfo() << ":";
            }